

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

double __thiscall
MADPComponentDiscreteStates::GetInitialStateProbability(MADPComponentDiscreteStates *this,Index sI)

{
  ostream *poVar1;
  undefined8 uVar2;
  E *pEVar3;
  reference pvVar4;
  stringstream *arg;
  E *this_00;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  stringstream ss_1;
  stringstream *in_stack_fffffffffffffc98;
  E *in_stack_fffffffffffffca0;
  stringstream local_330 [16];
  ostream local_320 [392];
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_c = in_ESI;
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteStates::GetInitialStateProbability(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  this_00 = (E *)(ulong)in_ESI;
  pEVar3 = (E *)std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(*(long *)(in_RDI + 0x30) + 8)
                          );
  if (this_00 < pEVar3) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)this_00,
                        (size_type)in_stack_fffffffffffffc98);
    return *pvVar4;
  }
  std::__cxx11::stringstream::stringstream(local_330);
  std::operator<<(local_320,
                  "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds"
                 );
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_00,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

double MADPComponentDiscreteStates::GetInitialStateProbability(Index sI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::GetInitialStateProbability("<< 
        sI<<") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    
    if(sI < _m_initialStateDistribution->size() )
    {
        if(DEBUG_MADP_DSTATES)    cout << "MultiAgentDecisionProcess::GetInitialStateProbability - index "<<sI<<" is okay, size is "<<_m_initialStateDistribution->size() <<endl;
        return(_m_initialStateDistribution->at(sI));
    }
    //else
    stringstream ss;
    ss << "MultiAgentDecisionProcess::GetInitialStateProbability - ERROR GetInitialStateProbability: index out of bounds";
    throw E(ss);
}